

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

ncnn_datareader_t ncnn_datareader_create(void)

{
  ncnn_datareader_t p_Var1;
  DataReader_c_api *this;
  ncnn_datareader_t dr;
  ncnn_datareader_t in_stack_ffffffffffffffd8;
  
  p_Var1 = (ncnn_datareader_t)malloc(0x18);
  this = (DataReader_c_api *)operator_new(0x10);
  DataReader_c_api::DataReader_c_api(this,in_stack_ffffffffffffffd8);
  p_Var1->pthis = this;
  p_Var1->scan = __ncnn_DataReader_scan;
  p_Var1->read = __ncnn_DataReader_read;
  return p_Var1;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create()
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReader_c_api(dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReader_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReader_read;
    return dr;
}